

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_srcs.cxx
# Opt level: O2

void __thiscall level_tools::reconstruct_sound_srcs(level_tools *this)

{
  anon_struct_8_2_947311e6_for_anon_union_8_3_f28016de_for__vector2<int>_1_0 aVar1;
  xr_level_snd_static *pxVar2;
  pointer ppsVar3;
  sound_src_data *psVar4;
  xr_scene_sound_srcs *pxVar5;
  xr_sound_src_object *this_00;
  xr_custom_object_vec *this_01;
  pointer ppsVar6;
  anon_union_8_3_f28016de_for__vector2<float>_1 aVar7;
  anon_union_8_3_f28016de_for__vector2<float>_1 aVar8;
  anon_union_8_3_f28016de_for__vector2<float>_1 aVar9;
  xr_name_gen name;
  xr_sound_src_object *local_38;
  
  if (this->m_level->m_snd_static != (xr_level_snd_static *)0x0) {
    xray_re::msg("building %s","sound_src.part");
    pxVar2 = this->m_level->m_snd_static;
    pxVar5 = xray_re::xr_scene::sound_srcs(this->m_scene);
    this_01 = &(pxVar5->super_xr_scene_objects).m_objects;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_01,(long)(pxVar2->m_sound_srcs).
                             super__Vector_base<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pxVar2->m_sound_srcs).
                             super__Vector_base<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
    xray_re::xr_name_gen::init(&name,(EVP_PKEY_CTX *)"sound_src");
    ppsVar3 = (pxVar2->m_sound_srcs).
              super__Vector_base<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppsVar6 = (pxVar2->m_sound_srcs).
                   super__Vector_base<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppsVar6 != ppsVar3;
        ppsVar6 = ppsVar6 + 1) {
      psVar4 = *ppsVar6;
      this_00 = (xr_sound_src_object *)operator_new(0xd0);
      xray_re::xr_sound_src_object::xr_sound_src_object(this_00,this->m_scene);
      std::__cxx11::string::assign((char *)&(this_00->super_xr_custom_object).m_name);
      (this_00->super_xr_custom_object).m_position.field_0.field_0.x =
           (psVar4->position).field_0.field_0.x;
      (this_00->super_xr_custom_object).m_position.field_0.field_0.y =
           (psVar4->position).field_0.field_0.y;
      (this_00->super_xr_custom_object).m_position.field_0.field_0.z =
           (psVar4->position).field_0.field_0.z;
      std::__cxx11::string::_M_assign((string *)&this_00->m_source_name);
      (this_00->m_sound_pos).field_0.field_0.x = (psVar4->position).field_0.field_0.x;
      (this_00->m_sound_pos).field_0.field_0.y = (psVar4->position).field_0.field_0.y;
      (this_00->m_sound_pos).field_0.field_0.z = (psVar4->position).field_0.field_0.z;
      this_00->m_volume = psVar4->volume;
      this_00->m_frequency = psVar4->freq;
      aVar1 = (psVar4->pause_time).field_0.field_0;
      aVar7._0_4_ = (float)aVar1.x;
      aVar7._4_4_ = (float)aVar1.y;
      (this_00->m_pause_time).field_0 = aVar7;
      aVar1 = (psVar4->active_time).field_0.field_0;
      aVar8._0_4_ = (float)aVar1.x;
      aVar8._4_4_ = (float)aVar1.y;
      (this_00->m_active_time).field_0 = aVar8;
      aVar1 = (psVar4->play_time).field_0.field_0;
      aVar9._0_4_ = (float)aVar1.x;
      aVar9._4_4_ = (float)aVar1.y;
      (this_00->m_play_time).field_0 = aVar9;
      local_38 = this_00;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_01,(xr_custom_object **)&local_38);
      xray_re::xr_name_gen::next(&name);
    }
    xray_re::xr_level::clear_snd_static(this->m_level);
    xray_re::xr_name_gen::~xr_name_gen(&name);
  }
  return;
}

Assistant:

void level_tools::reconstruct_sound_srcs()
{
	if (m_level->snd_static() == 0)
		return;
	msg("building %s", "sound_src.part");

	const sound_src_data_vec& sound_srcs = m_level->snd_static()->sound_srcs();

	xr_custom_object_vec& cobjects = m_scene->sound_srcs()->objects();
	cobjects.reserve(sound_srcs.size());

	xr_name_gen name("sound_src");
	for (sound_src_data_vec_cit it = sound_srcs.begin(), end = sound_srcs.end();
			it != end; ++it, name.next()) {
		const sound_src_data* sound_src = *it;
		xr_sound_src_object* new_sound_src = new xr_sound_src_object(*m_scene);
		new_sound_src->co_name() = name.get();
		new_sound_src->co_position().set(sound_src->position);
//		new_sound_src->flags() = 0;
//		new_sound_src->type() = SOUNDSRC_TYPE_0;
		new_sound_src->source_name() = sound_src->name;
		new_sound_src->sound_pos().set(sound_src->position);
		new_sound_src->volume() = sound_src->volume;
		new_sound_src->frequency() = sound_src->freq;
		new_sound_src->pause_time().set(float(sound_src->pause_time.x),
				float(sound_src->pause_time.y));
		new_sound_src->active_time().set(float(sound_src->active_time.x),
				float(sound_src->active_time.y));
		new_sound_src->play_time().set(float(sound_src->play_time.x),
				float(sound_src->play_time.y));
		cobjects.push_back(new_sound_src);
	}
	m_level->clear_snd_static();
}